

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QPointer<QHttp2Stream> __thiscall
QHash<unsigned_int,_QPointer<QHttp2Stream>_>::value
          (QHash<unsigned_int,_QPointer<QHttp2Stream>_> *this,uint *key)

{
  QPointer<QHttp2Stream> *pQVar1;
  QObject *extraout_RDX;
  QObject *extraout_RDX_00;
  QObject *pQVar2;
  Data *in_RDI;
  QPointer<QHttp2Stream> QVar3;
  QPointer<QHttp2Stream> *v;
  QPointer<QHttp2Stream> *in_stack_ffffffffffffffc8;
  Data *pDVar4;
  
  pDVar4 = in_RDI;
  pQVar1 = valueImpl<unsigned_int>
                     ((QHash<unsigned_int,_QPointer<QHttp2Stream>_> *)in_RDI,(uint *)in_RDI);
  if (pQVar1 == (QPointer<QHttp2Stream> *)0x0) {
    memset(in_RDI,0,0x10);
    QPointer<QHttp2Stream>::QPointer((QPointer<QHttp2Stream> *)0x2bf8bc);
    pQVar2 = extraout_RDX_00;
  }
  else {
    QPointer<QHttp2Stream>::QPointer((QPointer<QHttp2Stream> *)in_RDI,in_stack_ffffffffffffffc8);
    pQVar2 = extraout_RDX;
  }
  QVar3.wp.value = pQVar2;
  QVar3.wp.d = pDVar4;
  return (QPointer<QHttp2Stream>)QVar3.wp;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }